

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O2

Atom * __thiscall
OpenMD::MoleculeCreator::createAtom
          (MoleculeCreator *this,ForceField *ff,AtomStamp *stamp,LocalIndexManager *localIndexMan)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  AtomType *this_00;
  AtomType *this_01;
  DirectionalAtom *this_02;
  string atomTypeOverrideName;
  FixedChargeAdapter fca;
  string baseType;
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  string local_1a8 [11];
  
  pbVar1 = &(stamp->Type).data_;
  std::__cxx11::string::string((string *)local_1a8,(string *)pbVar1);
  this_00 = ForceField::getAtomType(ff,local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  if (this_00 == (AtomType *)0x0) {
    std::__cxx11::string::string((string *)local_1a8,(string *)pbVar1);
    snprintf(painCave.errMsg,2000,"Can not find Matching Atom Type for[%s]",
             local_1a8[0]._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)local_1a8);
    painCave.isFatal = 1;
    simError();
  }
  this_01 = this_00;
  if (stamp->hasOverride_ == true) {
    AtomType::getName_abi_cxx11_(&local_1c8,this_00);
    dVar2 = stamp->orCharge_;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<double>(dVar2);
    std::operator+(&local_208,&local_1c8,"_q=");
    std::__cxx11::stringbuf::str();
    std::operator+(&local_228,&local_208,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    this_01 = ForceField::getAtomType(ff,&local_228);
    if (this_01 == (AtomType *)0x0) {
      this_01 = (AtomType *)operator_new(0xf8);
      AtomType::AtomType(this_01);
      (*this_01->_vptr_AtomType[2])(this_01,this_00);
      AtomType::setIdent(this_01,(int)(ff->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
      AtomType::setName(this_01,&local_228);
      ForceField::addAtomType(ff,&local_228,this_01);
      local_208._M_dataplus._M_p = (pointer)this_01;
      FixedChargeAdapter::makeFixedCharge
                ((FixedChargeAdapter *)&local_208,
                 dVar2 * (ff->forceFieldOptions_).ChargeUnitScaling.data_);
    }
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  bVar3 = AtomType::isDirectional(this_01);
  if (bVar3) {
    this_02 = (DirectionalAtom *)operator_new(0x130);
    DirectionalAtom::DirectionalAtom(this_02,this_01);
  }
  else {
    this_02 = (DirectionalAtom *)operator_new(0x88);
    Atom::Atom((Atom *)this_02,this_01);
  }
  iVar4 = IndexListContainer::pop(&localIndexMan->atomIndexContainer_);
  (this_02->super_Atom).super_StuntDouble.localIndex_ = iVar4;
  return &this_02->super_Atom;
}

Assistant:

Atom* MoleculeCreator::createAtom(ForceField* ff, AtomStamp* stamp,
                                    LocalIndexManager* localIndexMan) {
    AtomType* atomType;
    Atom* atom;

    atomType = ff->getAtomType(stamp->getType());
    if (atomType == NULL) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Can not find Matching Atom Type for[%s]",
               stamp->getType().c_str());

      painCave.isFatal = 1;
      simError();
    }

    if (stamp->hasOverride()) {
      std::string baseType = atomType->getName();
      RealType oc          = stamp->getOverrideCharge();

      // Create a new atom type name that builds in the override charge:
      std::ostringstream ss;
      ss << oc;
      std::string atomTypeOverrideName = baseType + "_q=" + ss.str();

      // Maybe we've seen this before?

      AtomType* atB = ff->getAtomType(atomTypeOverrideName);

      if (atB == NULL) {
        // Nope, we've never seen it before, so make a new one:
        AtomType* atomTypeOverride = new AtomType();
        // Base points to the atomType we already found
        atomTypeOverride->useBase(atomType);
        int ident = ff->getNAtomType();
        atomTypeOverride->setIdent(ident);
        atomTypeOverride->setName(atomTypeOverrideName);
        ff->addAtomType(atomTypeOverrideName, atomTypeOverride);
        FixedChargeAdapter fca = FixedChargeAdapter(atomTypeOverride);
        RealType charge =
            ff->getForceFieldOptions().getChargeUnitScaling() * oc;
        fca.makeFixedCharge(charge);
        // officially use override type for this atom
	atomType = atomTypeOverride;
      } else {
        // we've previously created the override type for this atom, so use that
        // one:
        atomType = atB;
      }
    }

    // below code still have some kind of hard-coding smell
    if (atomType->isDirectional()) {
      DirectionalAtom* dAtom;
      dAtom = new DirectionalAtom(atomType);
      atom  = dAtom;
    } else {
      atom = new Atom(atomType);
    }

    atom->setLocalIndex(localIndexMan->getNextAtomIndex());

    return atom;
  }